

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O2

LinearSpace3fa * __thiscall
embree::Geometry::computeAlignedSpaceMB
          (LinearSpace3fa *__return_storage_ptr__,Geometry *this,size_t primID,BBox1f time_range)

{
  undefined8 *puVar1;
  allocator local_39;
  string local_38 [32];
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            (local_38,"computeAlignedSpace not implemented for this geometry",&local_39);
  *puVar1 = &PTR__rtcore_error_002496e8;
  *(undefined4 *)(puVar1 + 1) = 3;
  std::__cxx11::string::string((string *)(puVar1 + 2),local_38);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

virtual LinearSpace3fa computeAlignedSpaceMB(const size_t primID, const BBox1f time_range) const {
      throw_RTCError(RTC_ERROR_INVALID_OPERATION,"computeAlignedSpace not implemented for this geometry"); 
    }